

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void connectDebugSignals(shared_ptr<gui::MenuBar> *menuBar,string *name)

{
  string *name_00;
  shared_ptr<gui::Widget> *in_stack_ffffffffffffffd0;
  shared_ptr<gui::MenuBar> *in_stack_ffffffffffffffd8;
  Signal<gui::Widget_*,_const_gui::MenuList_&,_unsigned_long> *in_stack_ffffffffffffffe0;
  
  name_00 = (string *)&stack0xffffffffffffffe0;
  std::dynamic_pointer_cast<gui::Widget,gui::MenuBar>(in_stack_ffffffffffffffd8);
  connectDebugSignals(in_stack_ffffffffffffffd0,name_00);
  std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x11575b);
  std::__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x115765
            );
  gui::Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&)>
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)
             in_stack_ffffffffffffffe0,
             (_func_void_Widget_ptr_Button_Vector2<float>_ptr *)in_stack_ffffffffffffffd8);
  std::__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x115785
            );
  gui::Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&)>
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)
             in_stack_ffffffffffffffe0,
             (_func_void_Widget_ptr_Button_Vector2<float>_ptr *)in_stack_ffffffffffffffd8);
  std::__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1157a5
            );
  gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Vector2<float>const&)>
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)in_stack_ffffffffffffffe0,
             (_func_void_Widget_ptr_Vector2<float>_ptr *)in_stack_ffffffffffffffd8);
  std::__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1157c5
            );
  gui::Signal<gui::Widget*,gui::MenuList_const&,unsigned_long>::
  connect<void(&)(gui::Widget*,gui::MenuList_const&,unsigned_long)>
            (in_stack_ffffffffffffffe0,
             (_func_void_Widget_ptr_MenuList_ptr_unsigned_long *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void connectDebugSignals(const std::shared_ptr<gui::MenuBar>& menuBar, const std::string& name) {
    connectDebugSignals(std::dynamic_pointer_cast<gui::Widget>(menuBar), name);
    menuBar->onMousePress.connect(mousePress);
    menuBar->onMouseRelease.connect(mouseRelease);
    menuBar->onClick.connect(click);
    menuBar->onMenuItemClick.connect(menuItemClick);
}